

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_ReadFlagsFromStringDeathTest_HelpMatch::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  undefined8 extraout_RAX;
  FlagSaver fs;
  FlagSaver local_40;
  string local_38;
  
  FlagSaver::FlagSaver(&local_40);
  fprintf(_stderr,"Running test %s/%s\n","ReadFlagsFromStringDeathTest","HelpMatch");
  g_called_exit = '\0';
  gflags_exitfunc = CalledExit;
  paVar1 = &local_38.field_2;
  local_38.field_2._M_allocated_capacity._0_7_ = 0x616d706c65682d;
  local_38.field_2._M_local_buf[7] = 't';
  local_38.field_2._8_7_ = 0x657361623d6863;
  local_38._M_string_length = 0xf;
  local_38.field_2._M_local_buf[0xf] = '\0';
  local_38._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = GetArgv0();
  ReadFlagsFromString(&local_38,pcVar2,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  gflags_exitfunc = exit;
  if (g_called_exit != '\0') {
    FlagSaver::~FlagSaver(&local_40);
    return;
  }
  _GLOBAL__N_1::Test_ReadFlagsFromStringDeathTest_HelpMatch::Run();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&local_40);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(ReadFlagsFromStringDeathTest, HelpMatch) {
  EXPECT_DEATH(ReadFlagsFromString("-helpmatch=base", GetArgv0(), true),
               "");
}